

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O0

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,unsigned_long_long i)

{
  string local_38;
  unsigned_long_long local_18;
  unsigned_long_long i_local;
  Pipeline *this_local;
  
  local_18 = i;
  i_local = (unsigned_long_long)this;
  std::__cxx11::to_string(&local_38,i);
  writeString(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(unsigned long long i)
{
    this->writeString(std::to_string(i));
    return *this;
}